

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.cc
# Opt level: O0

void CRYPTO_hchacha20(uint8_t *out,uint8_t *key,uint8_t *nonce)

{
  ulong local_70;
  size_t i;
  uint32_t x [16];
  uint8_t *nonce_local;
  uint8_t *key_local;
  uint8_t *out_local;
  
  OPENSSL_memcpy(&i,"expand 32-byte k",0x10);
  OPENSSL_memcpy(x + 2,key,0x20);
  OPENSSL_memcpy(x + 10,nonce,0x10);
  for (local_70 = 0; local_70 < 0x14; local_70 = local_70 + 2) {
    i._0_4_ = x[2] + (uint)i;
    x[10] = CRYPTO_rotl_u32(x[10] ^ (uint)i,0x10);
    x[6] = x[10] + x[6];
    x[2] = CRYPTO_rotl_u32(x[2] ^ x[6],0xc);
    i._0_4_ = x[2] + (uint)i;
    x[10] = CRYPTO_rotl_u32(x[10] ^ (uint)i,8);
    x[6] = x[10] + x[6];
    x[2] = CRYPTO_rotl_u32(x[2] ^ x[6],7);
    i._4_4_ = x[3] + i._4_4_;
    x[0xb] = CRYPTO_rotl_u32(x[0xb] ^ i._4_4_,0x10);
    x[7] = x[0xb] + x[7];
    x[3] = CRYPTO_rotl_u32(x[3] ^ x[7],0xc);
    i._4_4_ = x[3] + i._4_4_;
    x[0xb] = CRYPTO_rotl_u32(x[0xb] ^ i._4_4_,8);
    x[7] = x[0xb] + x[7];
    x[3] = CRYPTO_rotl_u32(x[3] ^ x[7],7);
    x[0] = x[4] + x[0];
    x[0xc] = CRYPTO_rotl_u32(x[0xc] ^ x[0],0x10);
    x[8] = x[0xc] + x[8];
    x[4] = CRYPTO_rotl_u32(x[4] ^ x[8],0xc);
    x[0] = x[4] + x[0];
    x[0xc] = CRYPTO_rotl_u32(x[0xc] ^ x[0],8);
    x[8] = x[0xc] + x[8];
    x[4] = CRYPTO_rotl_u32(x[4] ^ x[8],7);
    x[1] = x[5] + x[1];
    x[0xd] = CRYPTO_rotl_u32(x[0xd] ^ x[1],0x10);
    x[9] = x[0xd] + x[9];
    x[5] = CRYPTO_rotl_u32(x[5] ^ x[9],0xc);
    x[1] = x[5] + x[1];
    x[0xd] = CRYPTO_rotl_u32(x[0xd] ^ x[1],8);
    x[9] = x[0xd] + x[9];
    x[5] = CRYPTO_rotl_u32(x[5] ^ x[9],7);
    i._0_4_ = x[3] + (uint)i;
    x[0xd] = CRYPTO_rotl_u32(x[0xd] ^ (uint)i,0x10);
    x[8] = x[0xd] + x[8];
    x[3] = CRYPTO_rotl_u32(x[3] ^ x[8],0xc);
    i._0_4_ = x[3] + (uint)i;
    x[0xd] = CRYPTO_rotl_u32(x[0xd] ^ (uint)i,8);
    x[8] = x[0xd] + x[8];
    x[3] = CRYPTO_rotl_u32(x[3] ^ x[8],7);
    i._4_4_ = x[4] + i._4_4_;
    x[10] = CRYPTO_rotl_u32(x[10] ^ i._4_4_,0x10);
    x[9] = x[10] + x[9];
    x[4] = CRYPTO_rotl_u32(x[4] ^ x[9],0xc);
    i._4_4_ = x[4] + i._4_4_;
    x[10] = CRYPTO_rotl_u32(x[10] ^ i._4_4_,8);
    x[9] = x[10] + x[9];
    x[4] = CRYPTO_rotl_u32(x[4] ^ x[9],7);
    x[0] = x[5] + x[0];
    x[0xb] = CRYPTO_rotl_u32(x[0xb] ^ x[0],0x10);
    x[6] = x[0xb] + x[6];
    x[5] = CRYPTO_rotl_u32(x[5] ^ x[6],0xc);
    x[0] = x[5] + x[0];
    x[0xb] = CRYPTO_rotl_u32(x[0xb] ^ x[0],8);
    x[6] = x[0xb] + x[6];
    x[5] = CRYPTO_rotl_u32(x[5] ^ x[6],7);
    x[1] = x[2] + x[1];
    x[0xc] = CRYPTO_rotl_u32(x[0xc] ^ x[1],0x10);
    x[7] = x[0xc] + x[7];
    x[2] = CRYPTO_rotl_u32(x[2] ^ x[7],0xc);
    x[1] = x[2] + x[1];
    x[0xc] = CRYPTO_rotl_u32(x[0xc] ^ x[1],8);
    x[7] = x[0xc] + x[7];
    x[2] = CRYPTO_rotl_u32(x[2] ^ x[7],7);
  }
  OPENSSL_memcpy(out,&i,0x10);
  OPENSSL_memcpy(out + 0x10,x + 10,0x10);
  return;
}

Assistant:

void CRYPTO_hchacha20(uint8_t out[32], const uint8_t key[32],
                      const uint8_t nonce[16]) {
  uint32_t x[16];
  OPENSSL_memcpy(x, sigma, sizeof(sigma));
  OPENSSL_memcpy(&x[4], key, 32);
  OPENSSL_memcpy(&x[12], nonce, 16);

  for (size_t i = 0; i < 20; i += 2) {
    QUARTERROUND(0, 4, 8, 12)
    QUARTERROUND(1, 5, 9, 13)
    QUARTERROUND(2, 6, 10, 14)
    QUARTERROUND(3, 7, 11, 15)
    QUARTERROUND(0, 5, 10, 15)
    QUARTERROUND(1, 6, 11, 12)
    QUARTERROUND(2, 7, 8, 13)
    QUARTERROUND(3, 4, 9, 14)
  }

  OPENSSL_memcpy(out, &x[0], sizeof(uint32_t) * 4);
  OPENSSL_memcpy(&out[16], &x[12], sizeof(uint32_t) * 4);
}